

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::setOptions(Options *this,int argc,char **argv)

{
  char *pcVar1;
  reference pvVar2;
  reference this_00;
  size_type sVar3;
  int local_28;
  int i;
  int oldsize;
  char **argv_local;
  int argc_local;
  Options *this_local;
  
  this->m_processedQ = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv,(long)argc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv_strings,(long)argc);
  for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
    pcVar1 = argv[local_28];
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_extraArgv_strings,(long)local_28);
    std::__cxx11::string::operator=((string *)pvVar2,pcVar1);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_extraArgv_strings,(long)local_28);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->m_extraArgv,(long)local_28);
    std::__cxx11::string::operator=((string *)this_00,(string *)pvVar2);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_extraArgv);
  this->m_oargc = (int)sVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_oargv,&this->m_extraArgv);
  return;
}

Assistant:

void Options::setOptions(int argc, char** argv) {
	m_processedQ = 0;

	m_extraArgv.resize(argc);
	m_extraArgv_strings.resize(argc);
	int oldsize = 0;

	int i;
	for (i=0; i<argc; i++) {
		m_extraArgv_strings[i+oldsize] = argv[i];
		m_extraArgv[i] = m_extraArgv_strings[i];
	}

	m_oargc  = (int)m_extraArgv.size();
	m_oargv  = m_extraArgv;
}